

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O2

int LZ4_decompress_safe_forceExtDict
              (char *source,char *dest,int compressedSize,int maxOutputSize,void *dictStart,
              size_t dictSize)

{
  ushort *puVar1;
  byte *pbVar2;
  byte *pbVar3;
  byte bVar4;
  ushort uVar5;
  undefined8 uVar6;
  ushort uVar7;
  int iVar8;
  long lVar9;
  ushort *puVar10;
  long lVar11;
  byte *pbVar12;
  byte *pbVar13;
  ushort *puVar14;
  uint uVar15;
  size_t __n;
  byte *pbVar16;
  ulong uVar17;
  BYTE *d;
  byte *pbVar18;
  byte *pbVar19;
  uint uVar20;
  byte *pbVar21;
  BYTE *e;
  BYTE *s_1;
  ushort *puVar22;
  ushort *__src;
  ushort *puVar23;
  ulong uVar24;
  int local_68;
  
  if (source == (char *)0x0) {
    return -1;
  }
  lVar9 = (long)dictStart + dictSize;
  if (dictStart == (void *)0x0) {
    lVar9 = 0;
  }
  if (maxOutputSize == 0) {
    if (compressedSize != 1) {
      return -1;
    }
    return -(uint)(*source != '\0');
  }
  if (compressedSize == 0) {
    return -1;
  }
  puVar1 = (ushort *)(source + compressedSize);
  pbVar2 = (byte *)(dest + maxOutputSize);
  pbVar19 = (byte *)dest;
  puVar23 = (ushort *)source;
  if (maxOutputSize < 0x40) goto LAB_001c51a7;
LAB_001c4e1f:
  __src = (ushort *)((long)puVar23 + 1);
  bVar4 = (byte)*puVar23;
  uVar17 = (ulong)(uint)(bVar4 >> 4);
  if (bVar4 >> 4 == 0xf) {
    if ((ushort *)((long)puVar1 - 0xfU) <= __src) goto LAB_001c5195;
    puVar14 = puVar23 + 1;
    uVar20 = 0;
    puVar23 = puVar23 + 8;
    do {
      puVar22 = __src;
      puVar10 = puVar23;
      __src = (ushort *)((long)puVar22 + 1);
      uVar20 = uVar20 + *(byte *)((long)puVar10 + -0xf);
      puVar14 = (ushort *)((long)puVar14 + 1);
      puVar23 = (ushort *)((long)puVar10 + 1);
    } while (puVar10 + -7 < (ushort *)((long)puVar1 - 0xfU) &&
             *(byte *)((long)puVar10 + -0xf) == 0xff);
    uVar17 = (ulong)uVar20 + 0xf;
    pbVar18 = pbVar19 + uVar17;
    if ((CARRY8((ulong)pbVar19,uVar17)) || ((ulong)-(long)puVar14 < uVar17)) {
      __src = puVar10 + -7;
      goto LAB_001c5195;
    }
    uVar15 = (uint)bVar4;
    if (dest + (long)maxOutputSize + -0x20 < pbVar18) goto LAB_001c528d;
    puVar23 = (ushort *)((ulong)uVar20 + (long)puVar10 + 1);
    if (puVar1 + -0x10 < puVar23) {
      __src = puVar10 + -7;
      uVar15 = (uint)bVar4;
      goto LAB_001c528d;
    }
    lVar11 = 0;
    do {
      uVar6 = *(undefined8 *)((byte *)((long)__src + lVar11) + 8);
      pbVar12 = pbVar19 + lVar11;
      *(undefined8 *)pbVar12 = *(undefined8 *)((long)__src + lVar11);
      *(undefined8 *)(pbVar12 + 8) = uVar6;
      pbVar3 = (byte *)((long)puVar22 + lVar11 + 0x11);
      uVar6 = *(undefined8 *)(pbVar3 + 8);
      *(undefined8 *)(pbVar12 + 0x10) = *(undefined8 *)pbVar3;
      *(undefined8 *)(pbVar12 + 0x18) = uVar6;
      lVar11 = lVar11 + 0x20;
    } while (pbVar12 + 0x20 < pbVar18);
  }
  else {
    pbVar18 = pbVar19 + uVar17;
    uVar15 = (uint)bVar4;
    if ((ushort *)((long)puVar1 - 0x11U) < __src) goto LAB_001c528d;
    uVar6 = *(undefined8 *)((long)puVar23 + 9);
    *(undefined8 *)pbVar19 = *(undefined8 *)__src;
    *(undefined8 *)(pbVar19 + 8) = uVar6;
    puVar23 = (ushort *)(uVar17 + (long)__src);
  }
  uVar5 = *puVar23;
  uVar17 = (ulong)uVar5;
  uVar15 = (uint)uVar5;
  __src = puVar23 + 1;
  pbVar12 = pbVar18 + -uVar17;
  uVar24 = (ulong)(bVar4 & 0xf);
  if (uVar24 == 0xf) {
    if ((dictSize < 0x10000) && (pbVar12 + dictSize < dest)) goto LAB_001c5195;
    uVar15 = 0;
    puVar23 = __src;
    do {
      __src = (ushort *)((long)puVar23 + 1);
      if (puVar1 + -2 <= __src) goto LAB_001c5195;
      uVar7 = *puVar23;
      uVar15 = uVar15 + (byte)uVar7;
      puVar23 = __src;
    } while ((byte)uVar7 == 0xff);
    uVar24 = (ulong)uVar15;
    if ((byte *)(-0x10 - uVar24) < pbVar18) goto LAB_001c5195;
    __n = uVar24 + 0x13;
    if (pbVar2 + -0x40 <= pbVar18 + uVar24 + 0x13) goto LAB_001c5335;
  }
  else {
    __n = uVar24 + 4;
    if (pbVar2 + -0x40 <= pbVar18 + uVar24 + 4) goto LAB_001c5338;
    if ((dest <= pbVar12) && (7 < uVar5)) {
      *(undefined8 *)pbVar18 = *(undefined8 *)pbVar12;
      *(undefined8 *)(pbVar18 + 8) = *(undefined8 *)(pbVar12 + 8);
      *(undefined2 *)(pbVar18 + 0x10) = *(undefined2 *)(pbVar12 + 0x10);
      pbVar19 = pbVar18 + uVar24 + 4;
      puVar23 = __src;
      goto LAB_001c4e1f;
    }
  }
  if ((dictSize < 0x10000) && (pbVar12 + dictSize < dest)) goto LAB_001c5195;
  pbVar3 = pbVar18 + __n;
  pbVar19 = pbVar3;
  puVar23 = __src;
  if (pbVar12 < dest) {
    if (pbVar2 + -5 < pbVar3) goto LAB_001c5195;
    uVar24 = (long)dest - (long)pbVar12;
    uVar17 = __n - uVar24;
    if (__n < uVar24 || uVar17 == 0) {
      memmove(pbVar18,(void *)(lVar9 - uVar24),__n);
    }
    else {
      memcpy(pbVar18,(void *)(lVar9 - uVar24),uVar24);
      pbVar19 = pbVar18 + uVar24;
      pbVar18 = (byte *)dest;
      if ((ulong)((long)pbVar19 - (long)dest) < uVar17) {
        for (; pbVar19 < pbVar3; pbVar19 = pbVar19 + 1) {
          *pbVar19 = *pbVar18;
          pbVar18 = pbVar18 + 1;
        }
      }
      else {
        memcpy(pbVar19,dest,uVar17);
        pbVar19 = pbVar3;
      }
    }
  }
  else {
    if (uVar5 < 0x10) {
      if (uVar17 == 4) {
        iVar8 = *(int *)pbVar12;
      }
      else if (uVar5 == 2) {
        iVar8 = CONCAT22(*(undefined2 *)pbVar12,*(undefined2 *)pbVar12);
      }
      else {
        if (uVar5 != 1) {
          if (uVar5 < 8) {
            pbVar18[0] = 0;
            pbVar18[1] = 0;
            pbVar18[2] = 0;
            pbVar18[3] = 0;
            *pbVar18 = *pbVar12;
            pbVar18[1] = pbVar12[1];
            pbVar18[2] = pbVar12[2];
            pbVar18[3] = pbVar12[3];
            uVar15 = inc32table[uVar5];
            *(undefined4 *)(pbVar18 + 4) = *(undefined4 *)(pbVar12 + uVar15);
            pbVar12 = pbVar12 + ((ulong)uVar15 - (long)dec64table[uVar5]);
          }
          else {
            *(undefined8 *)pbVar18 = *(undefined8 *)pbVar12;
            pbVar12 = pbVar12 + 8;
          }
          pbVar18 = pbVar18 + 8;
          do {
            *(undefined8 *)pbVar18 = *(undefined8 *)pbVar12;
            pbVar18 = pbVar18 + 8;
            pbVar12 = pbVar12 + 8;
          } while (pbVar18 < pbVar3);
          goto LAB_001c4e1f;
        }
        iVar8 = (uint)*pbVar12 * 0x1010101;
      }
      do {
        *(int *)pbVar18 = iVar8;
        *(int *)(pbVar18 + 4) = iVar8;
        pbVar18 = pbVar18 + 8;
      } while (pbVar18 < pbVar3);
      goto LAB_001c4e1f;
    }
    do {
      uVar6 = *(undefined8 *)(pbVar18 + -uVar17 + 8);
      *(undefined8 *)pbVar18 = *(undefined8 *)(pbVar18 + -uVar17);
      *(undefined8 *)(pbVar18 + 8) = uVar6;
      uVar6 = *(undefined8 *)(pbVar18 + -uVar17 + 0x10 + 8);
      *(undefined8 *)(pbVar18 + 0x10) = *(undefined8 *)(pbVar18 + -uVar17 + 0x10);
      *(undefined8 *)(pbVar18 + 0x18) = uVar6;
      pbVar18 = pbVar18 + 0x20;
    } while (pbVar18 < pbVar3);
  }
  goto LAB_001c4e1f;
LAB_001c5338:
  if ((dictSize < 0x10000) && (pbVar12 + dictSize < dest)) goto LAB_001c5195;
  pbVar3 = pbVar18 + __n;
  pbVar19 = pbVar3;
  puVar23 = __src;
  if (pbVar12 < dest) {
    if (pbVar2 + -5 < pbVar3) goto LAB_001c5195;
    uVar24 = (long)dest - (long)pbVar12;
    uVar17 = __n - uVar24;
    if (__n < uVar24 || uVar17 == 0) {
      memmove(pbVar18,(void *)(lVar9 - uVar24),__n);
    }
    else {
      memcpy(pbVar18,(void *)(lVar9 - uVar24),uVar24);
      pbVar19 = pbVar18 + uVar24;
      pbVar18 = (byte *)dest;
      if ((ulong)((long)pbVar19 - (long)dest) < uVar17) {
        for (; pbVar19 < pbVar3; pbVar19 = pbVar19 + 1) {
          *pbVar19 = *pbVar18;
          pbVar18 = pbVar18 + 1;
        }
      }
      else {
        memcpy(pbVar19,dest,uVar17);
        pbVar19 = pbVar3;
      }
    }
  }
  else {
    if (uVar15 < 8) {
      pbVar18[0] = 0;
      pbVar18[1] = 0;
      pbVar18[2] = 0;
      pbVar18[3] = 0;
      *pbVar18 = *pbVar12;
      pbVar18[1] = pbVar12[1];
      pbVar18[2] = pbVar12[2];
      pbVar18[3] = pbVar12[3];
      uVar17 = (ulong)*(uint *)((long)inc32table + (ulong)(uVar15 << 2));
      *(undefined4 *)(pbVar18 + 4) = *(undefined4 *)(pbVar12 + uVar17);
      pbVar12 = pbVar12 + (uVar17 - (long)*(int *)((long)dec64table + (ulong)(uVar15 << 2)));
    }
    else {
      *(undefined8 *)pbVar18 = *(undefined8 *)pbVar12;
      pbVar12 = pbVar12 + 8;
    }
    pbVar13 = pbVar18 + 8;
    if (pbVar2 + -0xc < pbVar3) {
      if (pbVar2 + -5 < pbVar3) goto LAB_001c5195;
      pbVar18 = pbVar2 + -7;
      pbVar16 = pbVar12;
      pbVar21 = pbVar13;
      if (pbVar13 < pbVar18) {
        do {
          *(undefined8 *)pbVar21 = *(undefined8 *)pbVar16;
          pbVar21 = pbVar21 + 8;
          pbVar16 = pbVar16 + 8;
        } while (pbVar21 < pbVar18);
        pbVar12 = pbVar12 + ((long)pbVar18 - (long)pbVar13);
        pbVar13 = pbVar18;
      }
      for (; pbVar13 < pbVar3; pbVar13 = pbVar13 + 1) {
        bVar4 = *pbVar12;
        pbVar12 = pbVar12 + 1;
        *pbVar13 = bVar4;
      }
    }
    else {
      *(undefined8 *)pbVar13 = *(undefined8 *)pbVar12;
      if (0x10 < __n) {
        pbVar18 = pbVar18 + 0x10;
        do {
          pbVar12 = pbVar12 + 8;
          *(undefined8 *)pbVar18 = *(undefined8 *)pbVar12;
          pbVar18 = pbVar18 + 8;
        } while (pbVar18 < pbVar3);
      }
    }
  }
LAB_001c51a7:
  while( true ) {
    __src = (ushort *)((long)puVar23 + 1);
    bVar4 = (byte)*puVar23;
    uVar17 = (ulong)(uint)(bVar4 >> 4);
    if (bVar4 >> 4 == 0xf) break;
    if ((source + (long)compressedSize + -0x10 <= __src) ||
       (dest + (long)maxOutputSize + -0x20 < pbVar19)) goto LAB_001c5289;
    uVar6 = *(undefined8 *)((long)puVar23 + 9);
    *(undefined8 *)pbVar19 = *(undefined8 *)__src;
    *(undefined8 *)(pbVar19 + 8) = uVar6;
    pbVar18 = pbVar19 + uVar17;
    uVar24 = (ulong)(bVar4 & 0xf);
    puVar23 = (ushort *)(uVar17 + (long)__src);
    __src = puVar23 + 1;
    uVar5 = *puVar23;
    uVar17 = (ulong)uVar5;
    pbVar12 = pbVar18 + -uVar17;
    if (((uVar24 == 0xf) || (uVar5 < 8)) || (pbVar12 < dest)) goto LAB_001c52db;
    *(undefined8 *)pbVar18 = *(undefined8 *)pbVar12;
    *(undefined8 *)(pbVar18 + 8) = *(undefined8 *)(pbVar12 + 8);
    *(undefined2 *)(pbVar18 + 0x10) = *(undefined2 *)(pbVar12 + 0x10);
    pbVar19 = pbVar18 + uVar24 + 4;
    puVar23 = __src;
  }
  if ((ushort *)((long)puVar1 - 0xfU) <= __src) goto LAB_001c5195;
  puVar23 = puVar23 + 1;
  uVar15 = 0;
  do {
    uVar5 = *__src;
    __src = (ushort *)((long)__src + 1);
    uVar15 = uVar15 + (byte)uVar5;
    puVar23 = (ushort *)((long)puVar23 + 1);
  } while (__src < (ushort *)((long)puVar1 - 0xfU) && (byte)uVar5 == 0xff);
  uVar17 = (ulong)uVar15 + 0xf;
  if ((CARRY8((ulong)pbVar19,uVar17)) || ((ulong)-(long)puVar23 < uVar17)) goto LAB_001c5195;
LAB_001c5289:
  pbVar18 = pbVar19 + uVar17;
  uVar15 = (uint)bVar4;
LAB_001c528d:
  puVar23 = (ushort *)(uVar17 + (long)__src);
  if ((pbVar2 + -0xc < pbVar18) || (puVar1 + -4 < puVar23)) {
    if ((puVar23 == puVar1) && (pbVar18 <= pbVar2)) {
      memmove(pbVar19,__src,uVar17);
      return ((int)pbVar19 + (int)uVar17) - (int)dest;
    }
LAB_001c5195:
    local_68 = (int)source;
    return ~(uint)__src + local_68;
  }
  do {
    *(undefined8 *)pbVar19 = *(undefined8 *)__src;
    pbVar19 = pbVar19 + 8;
    __src = __src + 4;
  } while (pbVar19 < pbVar18);
  uVar17 = (ulong)*puVar23;
  __src = puVar23 + 1;
  pbVar12 = pbVar18 + -uVar17;
  uVar24 = (ulong)(uVar15 & 0xf);
LAB_001c52db:
  if ((int)uVar24 == 0xf) {
    uVar15 = 0;
    do {
      uVar5 = *__src;
      __src = (ushort *)((long)__src + 1);
      uVar15 = uVar15 + (byte)uVar5;
    } while ((byte)uVar5 == 0xff && __src < puVar1 + -2);
    uVar24 = (ulong)uVar15 + 0xf;
    if ((puVar1 + -2 <= __src) || (CARRY8((ulong)pbVar18,uVar24))) goto LAB_001c5195;
  }
  __n = uVar24 + 4;
LAB_001c5335:
  uVar15 = (uint)uVar17;
  goto LAB_001c5338;
}

Assistant:

LZ4_FORCE_O2
int LZ4_decompress_safe_forceExtDict(const char* source, char* dest,
                                     int compressedSize, int maxOutputSize,
                                     const void* dictStart, size_t dictSize)
{
    return LZ4_decompress_generic(source, dest, compressedSize, maxOutputSize,
                                  endOnInputSize, decode_full_block, usingExtDict,
                                  (BYTE*)dest, (const BYTE*)dictStart, dictSize);
}